

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,complex<double> m00,complex<double> m01,
          complex<double> m10,complex<double> m11)

{
  complex<double> *pcVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  
  this->size_ = 2;
  alloc_unique_array<std::complex<double>>((dense *)&this->data_,4);
  pcVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)pcVar1->_M_value = in_XMM0_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM1_Qa;
  pcVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)pcVar1[1]._M_value = in_XMM4_Qa;
  *(undefined8 *)(pcVar1[1]._M_value + 8) = in_XMM5_Qa;
  pcVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)pcVar1[2]._M_value = in_XMM2_Qa;
  *(undefined8 *)(pcVar1[2]._M_value + 8) = in_XMM3_Qa;
  pcVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  *(undefined8 *)pcVar1[3]._M_value = in_XMM6_Qa;
  *(undefined8 *)(pcVar1[3]._M_value + 8) = in_XMM7_Qa;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }